

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_reader.hpp
# Opt level: O2

gets_result_type * __thiscall
pstore::http::
buffered_reader<int,_std::function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>_>
::gets_impl(gets_result_type *__return_storage_ptr__,
           buffered_reader<int,_std::function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>_>
           *this,int io,string *str)

{
  anon_class_32_1_ba1d7991 eos;
  error_or_n<int,_pstore::maybe<char>_> eStack_98;
  string local_80 [32];
  undefined1 local_60 [48];
  
  std::__cxx11::string::string(local_80,(string *)str);
  local_60._0_8_ = this;
  local_60._8_8_ = str;
  std::__cxx11::string::string((string *)(local_60 + 0x10),local_80);
  getc((buffered_reader<int,_std::function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>_>
        *)&eStack_98,(FILE *)this);
  pstore::operator>>=(__return_storage_ptr__,&eStack_98,(anon_class_48_3_c00c1b4b *)local_60);
  error_or<std::tuple<int,_pstore::maybe<char,_void>_>_>::~error_or(&eStack_98);
  std::__cxx11::string::~string((string *)(local_60 + 0x10));
  std::__cxx11::string::~string(local_80);
  return __return_storage_ptr__;
}

Assistant:

auto buffered_reader<IO, RefillFunction>::gets_impl (IO io, std::string const & str)
            -> gets_result_type {

            auto eos = [str] (IO io2) {
                // If this is the first character of the string, then return end-of-stream. If
                // instead we hit end-of-stream after reading one or more characters, return
                // what we've got.
                return gets_result_type{in_place, io2,
                                        str.empty () ? nothing<std::string> () : just (str)};
            };

            return this->getc (io) >>= [this, &str, eos] (IO io3, maybe<char> mc) {
                if (!mc) {
                    return eos (io3); // We saw end-of-stream.
                }

                constexpr auto cr = '\r';
                constexpr auto lf = '\n';
                switch (*mc) {
                case cr:
                    // We read a CR. If so, look to see if the next character is LF.
                    return this->getc (io3) >>= [this, str, eos, lf] (IO io4, maybe<char> mc2) {
                        if (!mc2) {
                            return eos (io4); // We saw end-of-stream.
                        }

                        if (*mc2 != lf) {
                            // We had a CR followed by something that's NOT an LF. Save it so
                            // that the next call to getc() will yield it again.
                            PSTORE_ASSERT (!push_);
                            // TODO: the conversion below assumes that we're only dealing
                            // with ASCII.
                            push_ = static_cast<std::uint8_t> (*mc2);
                        }
                        return gets_result_type{in_place, io4, just (str)};
                    };
                case lf: return gets_result_type{in_place, io3, just (str)};
                default: break;
                }

                if (str.length () >= max_string_length) {
                    return gets_result_type{make_error_code (error_code::string_too_long)};
                }
                return this->gets_impl (io3, str + *mc);
            };
        }